

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::SRGBDecodeTests::init(SRGBDecodeTests *this,EVP_PKEY_CTX *ctx)

{
  TestNode *node;
  TestNode *pTVar1;
  TestGroupConfig *local_158;
  TestCaseGroup *testGroup;
  size_t idx;
  TextureFormat local_58;
  TextureFormat *local_50;
  undefined1 local_48 [8];
  TestGroupConfig testGroupConfigList [2];
  SRGBDecodeTests *this_local;
  
  local_50 = (TextureFormat *)local_48;
  tcu::TextureFormat::TextureFormat(&local_58,sRGBA,UNORM_INT8);
  Functional::anon_unknown_0::TestGroupConfig::TestGroupConfig
            ((TestGroupConfig *)local_48,"srgba8","srgb decode tests using srgba internal format",
             local_58);
  local_50 = &testGroupConfigList[0].internalFormat;
  tcu::TextureFormat::TextureFormat((TextureFormat *)((long)&idx + 4),sR,UNORM_INT8);
  Functional::anon_unknown_0::TestGroupConfig::TestGroupConfig
            ((TestGroupConfig *)&testGroupConfigList[0].internalFormat,"sr8",
             "srgb decode tests using sr8 internal format",stack0xffffffffffffff94);
  for (testGroup = (TestCaseGroup *)0x0; testGroup < (TestCaseGroup *)0x2;
      testGroup = (TestCaseGroup *)((long)&(testGroup->super_TestNode)._vptr_TestNode + 1)) {
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               (char *)testGroupConfigList
                       [(long)((long)&testGroup[-1].super_TestNode.m_children.
                                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)].
                       internalFormat,testGroupConfigList[(long)testGroup].name);
    tcu::TestNode::addChild((TestNode *)this,node);
    pTVar1 = (TestNode *)operator_new(0x158);
    Functional::anon_unknown_0::TextureDecodeSkippedCase::TextureDecodeSkippedCase
              ((TextureDecodeSkippedCase *)pTVar1,(this->super_TestCaseGroup).m_context,"skipped",
               "testing for sRGB color values with sRGB texture decoding skipped",
               (TextureFormat)testGroupConfigList[(long)testGroup].description);
    tcu::TestNode::addChild(node,pTVar1);
    pTVar1 = (TestNode *)operator_new(0x158);
    Functional::anon_unknown_0::TextureDecodeEnabledCase::TextureDecodeEnabledCase
              ((TextureDecodeEnabledCase *)pTVar1,(this->super_TestCaseGroup).m_context,"enabled",
               "testing for linear color values with sRGB texture decoding enabled",
               (TextureFormat)testGroupConfigList[(long)testGroup].description);
    tcu::TestNode::addChild(node,pTVar1);
    pTVar1 = (TestNode *)operator_new(0x158);
    Functional::anon_unknown_0::TexelFetchDecodeSkippedcase::TexelFetchDecodeSkippedcase
              ((TexelFetchDecodeSkippedcase *)pTVar1,(this->super_TestCaseGroup).m_context,
               "texel_fetch","testing for linear color values with sRGB texture decoding skipped",
               (TextureFormat)testGroupConfigList[(long)testGroup].description);
    tcu::TestNode::addChild(node,pTVar1);
    pTVar1 = (TestNode *)operator_new(0x158);
    Functional::anon_unknown_0::GPUConversionDecodeEnabledCase::GPUConversionDecodeEnabledCase
              ((GPUConversionDecodeEnabledCase *)pTVar1,(this->super_TestCaseGroup).m_context,
               "conversion_gpu","sampling linear values and performing conversion on the gpu",
               (TextureFormat)testGroupConfigList[(long)testGroup].description);
    tcu::TestNode::addChild(node,pTVar1);
    pTVar1 = (TestNode *)operator_new(0x158);
    Functional::anon_unknown_0::DecodeToggledCase::DecodeToggledCase
              ((DecodeToggledCase *)pTVar1,(this->super_TestCaseGroup).m_context,"toggled",
               "toggle the sRGB decoding between draw calls",
               (TextureFormat)testGroupConfigList[(long)testGroup].description);
    tcu::TestNode::addChild(node,pTVar1);
    pTVar1 = (TestNode *)operator_new(0x158);
    Functional::anon_unknown_0::DecodeMultipleTexturesCase::DecodeMultipleTexturesCase
              ((DecodeMultipleTexturesCase *)pTVar1,(this->super_TestCaseGroup).m_context,
               "multiple_textures",
               "upload multiple textures with different sRGB decode values and sample",
               (TextureFormat)testGroupConfigList[(long)testGroup].description);
    tcu::TestNode::addChild(node,pTVar1);
    pTVar1 = (TestNode *)operator_new(0x158);
    Functional::anon_unknown_0::DecodeSamplerCase::DecodeSamplerCase
              ((DecodeSamplerCase *)pTVar1,(this->super_TestCaseGroup).m_context,"using_sampler",
               "testing that sampler object takes priority over texture state",
               (TextureFormat)testGroupConfigList[(long)testGroup].description);
    tcu::TestNode::addChild(node,pTVar1);
  }
  local_158 = (TestGroupConfig *)&testGroupConfigList[1].internalFormat;
  do {
    local_158 = local_158 + -1;
    Functional::anon_unknown_0::TestGroupConfig::~TestGroupConfig(local_158);
  } while (local_158 != (TestGroupConfig *)local_48);
  return (int)local_158;
}

Assistant:

void SRGBDecodeTests::init (void)
{
	const TestGroupConfig testGroupConfigList[] =
	{
		TestGroupConfig("srgba8",	"srgb decode tests using srgba internal format",	tcu::TextureFormat(tcu::TextureFormat::sRGBA, tcu::TextureFormat::UNORM_INT8)),
		TestGroupConfig("sr8",		"srgb decode tests using sr8 internal format",		tcu::TextureFormat(tcu::TextureFormat::sR, tcu::TextureFormat::UNORM_INT8))
	};

	// create groups for all desired internal formats, adding test cases to each
	for (std::size_t idx = 0; idx < DE_LENGTH_OF_ARRAY(testGroupConfigList); idx++)
	{
		tcu::TestCaseGroup* const testGroup = new tcu::TestCaseGroup(m_testCtx, testGroupConfigList[idx].name, testGroupConfigList[idx].description);
		tcu::TestNode::addChild(testGroup);

		testGroup->addChild(new TextureDecodeSkippedCase		(m_context, "skipped",			"testing for sRGB color values with sRGB texture decoding skipped",		testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new TextureDecodeEnabledCase		(m_context, "enabled",			"testing for linear color values with sRGB texture decoding enabled",	testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new TexelFetchDecodeSkippedcase		(m_context, "texel_fetch",		"testing for linear color values with sRGB texture decoding skipped",	testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new GPUConversionDecodeEnabledCase	(m_context, "conversion_gpu",	"sampling linear values and performing conversion on the gpu",			testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new DecodeToggledCase				(m_context, "toggled",			"toggle the sRGB decoding between draw calls",							testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new DecodeMultipleTexturesCase		(m_context, "multiple_textures","upload multiple textures with different sRGB decode values and sample",testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new DecodeSamplerCase				(m_context, "using_sampler",	"testing that sampler object takes priority over texture state",		testGroupConfigList[idx].internalFormat));
	}
}